

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Template.hpp
# Opt level: O2

void __thiscall
Qentem::TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::render
          (TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *this,TagBit *tag,
          TagBit *end,SizeT offset,SizeT end_offset)

{
  undefined4 in_register_0000000c;
  SizeT local_34;
  
  local_34 = offset;
  for (; tag < end; tag = tag + 1) {
    switch(tag->type_) {
    case Variable:
      renderVariable(this,(VariableTag *)tag->storage_,&local_34);
      break;
    case RawVariable:
      renderRawVariable(this,(VariableTag *)tag->storage_,&local_34);
      break;
    case Math:
      renderMath(this,(MathTag *)tag->storage_,&local_34);
      break;
    case SuperVariable:
      renderSuperVariable(this,(SuperVariableTag *)tag->storage_,&local_34);
      break;
    case InLineIf:
      renderInLineIf(this,(InLineIfTag *)tag->storage_,&local_34);
      break;
    case Loop:
      renderLoop(this,(LoopTag *)tag->storage_,&local_34);
      break;
    case If:
      renderIf(this,(IfTag *)tag->storage_,&local_34);
    }
  }
  StringStream<char>::write
            (this->stream_,local_34 + (int)this->content_,(void *)(ulong)(end_offset - local_34),
             CONCAT44(in_register_0000000c,offset));
  return;
}

Assistant:

void render(const TagBit *tag, const TagBit *end, SizeT offset, SizeT end_offset) const {
        while (tag < end) {
            switch (tag->GetType()) {
                case TagType::Variable: {
                    renderVariable(tag->GetVariableTag(), offset);
                    break;
                }

                case TagType::RawVariable: {
                    renderRawVariable(tag->GetVariableTag(), offset);
                    break;
                }

                case TagType::Math: {
                    renderMath(tag->GetMathTag(), offset);
                    break;
                }

                case TagType::SuperVariable: {
                    renderSuperVariable(tag->GetSuperVariableTag(), offset);
                    break;
                }

                case TagType::InLineIf: {
                    renderInLineIf(tag->GetInLineIfTag(), offset);
                    break;
                }

                case TagType::Loop: {
                    renderLoop(tag->GetLoopTag(), offset);
                    break;
                }

                case TagType::If: {
                    renderIf(tag->GetIfTag(), offset);
                    break;
                }

                default: {
                }
            }

            ++tag;
        }

        stream_->Write((content_ + offset), (end_offset - offset));
    }